

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

int SSL_SESSION_set1_id(SSL_SESSION *session,uint8_t *sid,size_t sid_len)

{
  bool bVar1;
  Span<const_unsigned_char> local_38;
  size_t local_28;
  size_t sid_len_local;
  uint8_t *sid_local;
  SSL_SESSION *session_local;
  
  local_28 = sid_len;
  sid_len_local = (size_t)sid;
  sid_local = (uint8_t *)session;
  bssl::Span<const_unsigned_char>::Span(&local_38,sid,sid_len);
  bVar1 = bssl::InplaceVector<unsigned_char,_32UL>::TryCopyFrom(&session->session_id,local_38);
  if (!bVar1) {
    ERR_put_error(0x10,0,0x122,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                  ,0x357);
  }
  session_local._4_4_ = (uint)bVar1;
  return session_local._4_4_;
}

Assistant:

int SSL_SESSION_set1_id(SSL_SESSION *session, const uint8_t *sid,
                        size_t sid_len) {
  if (!session->session_id.TryCopyFrom(Span(sid, sid_len))) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SSL_SESSION_ID_TOO_LONG);
    return 0;
  }

  return 1;
}